

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCntAutoPtr.hpp
# Opt level: O1

void __thiscall
Diligent::RefCntAutoPtr<Diligent::SerializedShaderImpl>::RefCntAutoPtr
          (RefCntAutoPtr<Diligent::SerializedShaderImpl> *this,
          RefCntAutoPtr<Diligent::SerializedShaderImpl> *AutoPtr)

{
  SerializedShaderImpl *pSVar1;
  char (*in_RCX) [26];
  string msg;
  string local_28;
  
  pSVar1 = AutoPtr->m_pObject;
  this->m_pObject = pSVar1;
  if (pSVar1 != (SerializedShaderImpl *)0x0) {
    if ((pSVar1->super_ObjectBase<Diligent::ISerializedShader>).
        super_RefCountedObject<Diligent::ISerializedShader>.m_pRefCounters == (RefCountersImpl *)0x0
       ) {
      FormatString<char[26],char[26]>
                (&local_28,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"m_pRefCounters != nullptr",in_RCX);
      DebugAssertionFailed
                (local_28._M_dataplus._M_p,"AddRef",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/../../Common/interface/RefCountedObjectImpl.hpp"
                 ,0x221);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_28._M_dataplus._M_p != &local_28.field_2) {
        operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
      }
    }
    RefCountersImpl::AddStrongRef
              ((pSVar1->super_ObjectBase<Diligent::ISerializedShader>).
               super_RefCountedObject<Diligent::ISerializedShader>.m_pRefCounters);
  }
  return;
}

Assistant:

RefCntAutoPtr(const RefCntAutoPtr& AutoPtr) noexcept :
        m_pObject{AutoPtr.m_pObject}
    {
        if (m_pObject)
            m_pObject->AddRef();
    }